

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void cJump(item *x)

{
  int op;
  typeDesc *ptVar1;
  
  ptVar1 = getType(x->typeIndex);
  if (ptVar1->form == 0x325) {
    if (x->mode != 0x2c3) {
      loadBool(x);
    }
    op = selectOpNegated(x->c);
    put(op,x->r,0,x->a);
    regs[x->r] = 0;
    fixLink(x->b);
    x->a = pc + -1;
    return;
  }
  mark("boolean ?");
  exit(-1);
}

Assistant:

procedure
void cJump(struct item *x) {
	variable int riscOp;
	variable struct typeDesc *type;
	type = NULL;
	riscOp = 0;
	type = getType(x->typeIndex);
	if (type->form == FORM_BOOL) {
		if (x->mode != CLASS_COND) {
			loadBool(x);
		}
		riscOp = selectOpNegated(x->c);
		put(riscOp,x->r,0,x->a);
		regs[x->r] = 0;
		fixLink(x->b);
		x->a = pc - 1;
	} else {
		mark("boolean ?");
		exit(-1);
	}
}